

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O0

Mzp * patch_string_table(Mzp *__return_storage_ptr__,json *translation_db,Mzp *mzp_archive)

{
  pointer *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  code *pcVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference this_01;
  long lVar8;
  void *__dest;
  void *__src;
  size_t __n;
  reference puVar9;
  uint32_t *puVar10;
  string local_258;
  string local_238;
  uint32_t local_218;
  uint32_t local_214;
  uint32_t be_offset;
  uint32_t offset;
  iterator __end2_2;
  iterator __begin2_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_2;
  string local_1f0 [4];
  uint32_t offset_write_offset;
  string serialized_new_offsets;
  uint local_1c8 [2];
  unsigned_long local_1c0;
  unsigned_long local_1b8;
  undefined1 local_1b0 [8];
  string padded_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_168 [4];
  uint32_t text_write_offset;
  string new_text_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> new_text_offsets;
  string translated_line;
  value_type *script_text_by_hash;
  string line_to_insert;
  undefined1 local_c8 [8];
  string line_digest_hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translated_strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  original_strings;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  uint string_table_idx;
  uint offset_table_idx;
  uint i;
  Mzp *mzp_archive_local;
  json *translation_db_local;
  Mzp *ret;
  
  sVar4 = std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          size(&mzp_archive->entry_headers);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&mzp_archive->entry_data);
  if (sVar4 != sVar5) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar4 = std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          size(&mzp_archive->entry_headers);
  if ((sVar4 & 1) != 0) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  mg::data::Mzp::Mzp(__return_storage_ptr__);
  for (string_table_idx = 0;
      sVar4 = std::
              vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
              ::size(&mzp_archive->entry_headers), string_table_idx < sVar4;
      string_table_idx = string_table_idx + 2) {
    offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = string_table_idx;
    offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = string_table_idx + 1;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&mzp_archive->entry_data,(ulong)string_table_idx);
    parse_offset_table((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,pvVar6);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&mzp_archive->entry_data,
                          (ulong)(uint)offsets.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    extract_string_table
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&translated_strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar6,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    __stream = _stderr;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&translated_strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    fprintf(__stream,"Loaded %lu strings from tables %u+%u\n",sVar4,
            (ulong)offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,
            (ulong)(uint)offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    this = &translated_strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
    line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&line), bVar2) {
      line_digest_hex.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      mg::util::sha256((string *)((long)&line_to_insert.field_2 + 8),
                       (string *)line_digest_hex.field_2._8_8_);
      mg::string::bytes_to_hex((string *)local_c8,(string *)((long)&line_to_insert.field_2 + 8));
      std::__cxx11::string::~string((string *)(line_to_insert.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)&script_text_by_hash,(string *)line_digest_hex.field_2._8_8_);
      pvVar7 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)translation_db,"script_text_by_hash");
      bVar2 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                        (pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8);
      if (bVar2) {
        this_01 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[](pvVar7,(key_type *)local_c8);
        bVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          (this_01,&TARGET_LANGUAGE_abi_cxx11_);
        if (bVar2) {
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar7,(key_type *)local_c8);
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar7,&TARGET_LANGUAGE_abi_cxx11_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &new_text_offsets.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pvVar7);
          lVar8 = std::__cxx11::string::size();
          if (lVar8 != 0) {
            std::__cxx11::string::operator=
                      ((string *)&script_text_by_hash,
                       (string *)
                       &new_text_offsets.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &new_text_offsets.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &script_text_by_hash);
      std::__cxx11::string::~string((string *)&script_text_by_hash);
      std::__cxx11::string::~string((string *)local_c8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8));
    std::__cxx11::string::string(local_168);
    __range2_1._4_4_ = 0;
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
    line_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&line_1), bVar2) {
      padded_line.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     padded_line.field_2._8_8_,"\r\n");
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_168);
      __dest = (void *)std::__cxx11::string::operator[]((ulong)local_168);
      __src = (void *)std::__cxx11::string::data();
      __n = std::__cxx11::string::size();
      memcpy(__dest,__src,__n);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (new_text_data.field_2._M_local_buf + 8),(uint *)((long)&__range2_1 + 4));
      iVar3 = std::__cxx11::string::size();
      __range2_1._4_4_ = __range2_1._4_4_ + iVar3;
      std::__cxx11::string::~string((string *)local_1b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    local_1b8 = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8),&local_1b8);
    local_1c0 = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8),&local_1c0);
    local_1c8[1] = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8),local_1c8 + 1);
    local_1c8[0] = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8),local_1c8);
    serialized_new_offsets.field_2._12_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8),
               (uint *)(serialized_new_offsets.field_2._M_local_buf + 0xc));
    std::__cxx11::string::string(local_1f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8));
    std::__cxx11::string::resize((ulong)local_1f0);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((long)&new_text_data.field_2 + 8);
    __end2_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    _be_offset = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&be_offset), bVar2) {
      puVar9 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2_2);
      local_214 = *puVar9;
      local_218 = mg::host_to_be_u32(local_214);
      puVar10 = (uint32_t *)std::__cxx11::string::operator[]((ulong)local_1f0);
      *puVar10 = local_218;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2_2);
    }
    std::__cxx11::string::string((string *)&local_238,local_1f0);
    mg::data::Mzp::add_entry(__return_storage_ptr__,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::string((string *)&local_258,local_168);
    mg::data::Mzp::add_entry(__return_storage_ptr__,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_168);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&new_text_data.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&translated_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

mg::data::Mzp patch_string_table(const nlohmann::json &translation_db,
                                 const mg::data::Mzp mzp_archive) {
  // The MZP archive consists of N pairs of string offset table + string data
  // table. For each pair, iterate the string table, extract the string, hash
  // it, check if the translated string exists, and if so inject the translated
  // string instead.
  ASSERT(mzp_archive.entry_headers.size() == mzp_archive.entry_data.size());
  ASSERT(mzp_archive.entry_headers.size() % 2 == 0);

  // Return MZP
  mg::data::Mzp ret;

  for (unsigned i = 0; i < mzp_archive.entry_headers.size(); i += 2) {
    const unsigned offset_table_idx = i;
    const unsigned string_table_idx = i + 1;

    // Extract original strings
    const std::vector<uint32_t> offsets =
        parse_offset_table(mzp_archive.entry_data[offset_table_idx]);
    const std::vector<std::string> original_strings =
        extract_string_table(mzp_archive.entry_data[string_table_idx], offsets);
    fprintf(stderr, "Loaded %lu strings from tables %u+%u\n",
            original_strings.size(), offset_table_idx, string_table_idx);

    // Iterate the strings, and replace any translated ones with the appropriate
    // text
    std::vector<std::string> translated_strings;
    for (auto &line : original_strings) {
      // Hash the line
      const std::string line_digest_hex =
          mg::string::bytes_to_hex(mg::util::sha256(line));

      // If we find nothing, fall back to the original text
      std::string line_to_insert = line;

      // Is this hash in our TL DB?
      auto &script_text_by_hash = translation_db["script_text_by_hash"];
      if (script_text_by_hash.contains(line_digest_hex)) {
        if (script_text_by_hash[line_digest_hex].contains(TARGET_LANGUAGE)) {
          const std::string translated_line =
              script_text_by_hash[line_digest_hex][TARGET_LANGUAGE];
          if (translated_line.size() > 0) {
            // We have a translation
            line_to_insert = translated_line;
          }
        }
      }

      // Append the line to our output vector
      translated_strings.emplace_back(line_to_insert);
    }

    // Now that we have a vector of translated strings, we need to insert them
    // back into the MZP and update the offset table.
    // Note that during reinsertion, we re-add the \r\n escape sequence at the
    // end of each line
    std::vector<uint32_t> new_text_offsets;
    std::string new_text_data;
    uint32_t text_write_offset = 0;
    for (auto &line : translated_strings) {
      // Append \r\n
      const std::string padded_line = line + "\r\n";

      // Append this string to our buffer
      new_text_data.resize(new_text_data.size() + padded_line.size());
      memcpy(&new_text_data[text_write_offset], padded_line.data(),
             padded_line.size());

      // Add that offset for this string to the offset table
      new_text_offsets.emplace_back(text_write_offset);

      // Increment the write pointer by the size of the string
      text_write_offset += padded_line.size();
    }

    // For some reason, the offsets seem to include 2 instances of offsets that
    // point to the final byte of the string table. Recreate them here in case
    // the game actually needs this info.
    new_text_offsets.emplace_back(new_text_data.size());
    new_text_offsets.emplace_back(new_text_data.size());

    // The offset table ends with 12 bytes of 0xFF
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);

    // Now that we have the new string data, and the new list of offsets, pack
    // the list of offsets back into a byte array
    std::string serialized_new_offsets;
    serialized_new_offsets.resize(new_text_offsets.size() * sizeof(uint32_t));
    uint32_t offset_write_offset = 0;
    for (uint32_t offset : new_text_offsets) {
      const uint32_t be_offset = mg::host_to_be_u32(offset);
      memcpy(&serialized_new_offsets[offset_write_offset], &be_offset,
             sizeof(be_offset));
      offset_write_offset += sizeof(uint32_t);
    }

    // Add the new segments to our output MZP
    ret.add_entry(serialized_new_offsets);
    ret.add_entry(new_text_data);
  }

  return ret;
}